

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack1to4_int8.h
# Opt level: O1

void ncnn::im2col_sgemm_pack1to4_int8_sse(Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Option *opt)

{
  uint uVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int *piVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  void *pvVar11;
  undefined1 *puVar12;
  uint _h;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  uint uVar18;
  long lVar19;
  undefined1 (*pauVar20) [16];
  uint uVar21;
  long lVar22;
  ulong *puVar23;
  size_t _elemsize;
  long lVar24;
  undefined1 *puVar25;
  undefined1 (*pauVar26) [16];
  int iVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  ulong uVar31;
  int iVar32;
  long lVar33;
  uint uVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [64];
  undefined1 auVar37 [16];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  long local_c0;
  Mat local_a8;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  Mat *local_40;
  ulong local_38;
  
  iVar9 = cpu_support_x86_avx2();
  if (iVar9 != 0) {
    im2col_sgemm_pack1to4_int8_sse_avx2(bottom_im2col,top_blob,kernel,opt);
    return;
  }
  iVar9 = cpu_support_x86_xop();
  if (iVar9 == 0) {
    uVar1 = bottom_im2col->w;
    uVar21 = bottom_im2col->h;
    uVar16 = (ulong)uVar21;
    uVar2 = bottom_im2col->c;
    lVar33 = (long)(int)uVar2;
    local_50 = (ulong)(uint)top_blob->c;
    local_a8.cstep = 0;
    local_a8.data = (void *)0x0;
    local_a8.refcount._0_4_ = 0;
    local_a8.refcount._4_4_ = 0;
    local_a8.elemsize = 0;
    local_a8.elempack = 0;
    local_a8.allocator = (Allocator *)0x0;
    local_a8.dims = 0;
    local_a8.w = 0;
    local_a8.h = 0;
    local_a8.d = 0;
    local_a8.c = 0;
    uVar34 = uVar1;
    uVar18 = uVar21;
    if (lVar33 < 4) {
      iVar9 = 1;
      _elemsize = 1;
      _h = uVar2;
      if (1 < (int)uVar1) {
        uVar34 = (uVar1 & 1) + (uVar1 >> 1);
        uVar18 = uVar21 * 2;
      }
    }
    else if ((int)uVar1 < 2) {
      iVar9 = 4;
      _elemsize = 4;
      _h = (uVar2 & 3) + (uVar2 >> 2);
    }
    else {
      iVar9 = 4;
      _elemsize = 4;
      uVar34 = (uVar1 & 1) + (uVar1 >> 1);
      uVar18 = uVar21 * 2;
      _h = (uVar2 & 3) + (uVar2 >> 2);
    }
    local_40 = top_blob;
    Mat::create(&local_a8,uVar18,_h,uVar34,_elemsize,iVar9,opt->workspace_allocator);
    local_58 = (ulong)uVar2;
    uVar10 = (ulong)(int)uVar1;
    if (0 < (int)uVar1 >> 1) {
      local_48 = (ulong)(uint)((int)uVar1 >> 1);
      local_c0 = 1;
      lVar22 = 0;
      uVar31 = 0;
      do {
        puVar25 = (undefined1 *)(local_a8.cstep * uVar31 * local_a8.elemsize + (long)local_a8.data);
        if ((int)uVar2 < 4) {
          uVar15 = 0;
        }
        else {
          lVar28 = 3;
          lVar29 = 1;
          lVar30 = 2;
          uVar13 = 0;
          do {
            if (0 < (int)uVar21) {
              pvVar11 = bottom_im2col->data;
              lVar24 = bottom_im2col->cstep * bottom_im2col->elemsize;
              lVar14 = lVar24 * uVar13 + lVar22;
              lVar8 = lVar24 * lVar28 + local_c0;
              lVar19 = lVar24 * lVar29 + lVar22;
              lVar24 = lVar24 * lVar30 + lVar22;
              lVar17 = 0;
              uVar15 = uVar16;
              do {
                *puVar25 = *(undefined1 *)((long)pvVar11 + lVar17 + lVar14);
                puVar25[1] = *(undefined1 *)((long)pvVar11 + lVar17 + lVar19);
                puVar25[2] = *(undefined1 *)((long)pvVar11 + lVar17 + lVar24);
                puVar25[3] = *(undefined1 *)((long)pvVar11 + lVar17 + lVar8 + -1);
                puVar25[4] = *(undefined1 *)((long)pvVar11 + lVar17 + lVar14 + 1);
                puVar25[5] = *(undefined1 *)((long)pvVar11 + lVar17 + lVar19 + 1);
                puVar25[6] = *(undefined1 *)((long)pvVar11 + lVar17 + lVar24 + 1);
                puVar25[7] = *(undefined1 *)((long)pvVar11 + lVar17 + lVar8);
                puVar25 = puVar25 + 8;
                lVar17 = lVar17 + uVar10;
                uVar34 = (int)uVar15 - 1;
                uVar15 = (ulong)uVar34;
              } while (uVar34 != 0);
            }
            uVar15 = uVar13 + 4;
            lVar14 = uVar13 + 7;
            lVar28 = lVar28 + 4;
            lVar29 = lVar29 + 4;
            lVar30 = lVar30 + 4;
            uVar13 = uVar15;
          } while (lVar14 < lVar33);
        }
        if ((int)uVar15 < (int)uVar2) {
          uVar15 = uVar15 & 0xffffffff;
          do {
            if (0 < (int)uVar21) {
              pvVar11 = (void *)(bottom_im2col->cstep * bottom_im2col->elemsize * uVar15 +
                                (long)bottom_im2col->data);
              uVar13 = uVar16;
              do {
                *puVar25 = *(undefined1 *)((long)pvVar11 + lVar22);
                puVar25[1] = *(undefined1 *)((long)pvVar11 + lVar22 + 1);
                puVar25 = puVar25 + 2;
                pvVar11 = (void *)((long)pvVar11 + uVar10);
                uVar34 = (int)uVar13 - 1;
                uVar13 = (ulong)uVar34;
              } while (uVar34 != 0);
            }
            uVar15 = uVar15 + 1;
          } while (uVar15 != local_58);
        }
        uVar31 = uVar31 + 1;
        lVar22 = lVar22 + 2;
        local_c0 = local_c0 + 2;
        local_38 = uVar16;
      } while (uVar31 != local_48);
    }
    uVar16 = uVar10 & 0xfffffffffffffffe;
    if ((uint)uVar16 != uVar1) {
      local_c0 = 0;
      uVar31 = uVar16;
      do {
        uVar34 = ((uint)(uVar31 >> 0x1f) & 1) + (int)uVar31;
        puVar25 = (undefined1 *)
                  ((long)(int)(((int)uVar34 >> 1) + ((int)uVar31 - (uVar34 & 0xfffffffe))) *
                   local_a8.cstep * local_a8.elemsize + (long)local_a8.data);
        if ((int)uVar2 < 4) {
          uVar15 = 0;
        }
        else {
          lVar22 = 1;
          lVar28 = 2;
          lVar29 = 3;
          uVar13 = 0;
          do {
            if (0 < (int)uVar21) {
              pvVar11 = bottom_im2col->data;
              lVar24 = bottom_im2col->cstep * bottom_im2col->elemsize;
              lVar14 = (long)pvVar11 + lVar24 * uVar13 + local_c0;
              lVar19 = (long)pvVar11 + lVar24 * lVar22 + local_c0;
              lVar30 = (long)pvVar11 + lVar24 * lVar28 + local_c0;
              lVar24 = (long)pvVar11 + lVar24 * lVar29 + local_c0;
              uVar34 = uVar21;
              do {
                *puVar25 = *(undefined1 *)(lVar14 + uVar16);
                puVar25[1] = *(undefined1 *)(lVar19 + uVar16);
                puVar25[2] = *(undefined1 *)(lVar30 + uVar16);
                puVar25[3] = *(undefined1 *)(lVar24 + uVar16);
                puVar25 = puVar25 + 4;
                lVar14 = lVar14 + uVar10;
                lVar19 = lVar19 + uVar10;
                lVar30 = lVar30 + uVar10;
                lVar24 = lVar24 + uVar10;
                uVar34 = uVar34 - 1;
              } while (uVar34 != 0);
            }
            uVar15 = uVar13 + 4;
            lVar30 = uVar13 + 7;
            lVar22 = lVar22 + 4;
            lVar28 = lVar28 + 4;
            lVar29 = lVar29 + 4;
            uVar13 = uVar15;
          } while (lVar30 < lVar33);
        }
        if ((int)uVar15 < (int)uVar2) {
          uVar15 = uVar15 & 0xffffffff;
          do {
            if (0 < (int)uVar21) {
              puVar12 = (undefined1 *)
                        ((long)bottom_im2col->data +
                        uVar31 + bottom_im2col->cstep * uVar15 * bottom_im2col->elemsize);
              uVar34 = uVar21;
              do {
                *puVar25 = *puVar12;
                puVar25 = puVar25 + 1;
                puVar12 = puVar12 + uVar10;
                uVar34 = uVar34 - 1;
              } while (uVar34 != 0);
            }
            uVar15 = uVar15 + 1;
          } while (uVar15 != local_58);
        }
        uVar31 = uVar31 + 1;
        local_c0 = local_c0 + 1;
      } while ((long)uVar31 < (long)uVar10);
    }
    if (0 < (int)local_50) {
      uVar34 = uVar2 + 3;
      if (-1 < (int)uVar2) {
        uVar34 = uVar2;
      }
      iVar9 = ((int)uVar34 >> 2) * uVar21;
      iVar32 = ((int)uVar2 % 4) * uVar21;
      uVar16 = 0;
      do {
        pauVar20 = (undefined1 (*) [16])
                   (local_40->cstep * uVar16 * local_40->elemsize + (long)local_40->data);
        if ((int)uVar1 < 2) {
          uVar31 = 0;
        }
        else {
          uVar15 = 0;
          do {
            puVar23 = (ulong *)((uVar15 >> 1) * local_a8.cstep * local_a8.elemsize +
                               (long)local_a8.data);
            pauVar26 = (undefined1 (*) [16])
                       (kernel->cstep * uVar16 * kernel->elemsize + (long)kernel->data);
            auVar36 = ZEXT1664((undefined1  [16])0x0);
            if (iVar9 < 1) {
              auVar38 = ZEXT1664((undefined1  [16])0x0);
            }
            else {
              auVar39 = ZEXT1664((undefined1  [16])0x0);
              auVar40 = ZEXT1664((undefined1  [16])0x0);
              auVar38 = ZEXT1664((undefined1  [16])0x0);
              iVar27 = iVar9;
              do {
                auVar37._8_8_ = 0;
                auVar37._0_8_ = *puVar23;
                auVar3 = vpmovsxbw_avx(auVar37);
                auVar37 = *pauVar26;
                auVar35 = vpcmpgtb_avx((undefined1  [16])0x0,auVar37);
                auVar6 = vpunpcklbw_avx(auVar37,auVar35);
                auVar5 = vpunpckhbw_avx(auVar37,auVar35);
                auVar35 = vpshufd_avx(auVar3,0x44);
                auVar37 = vpmaddwd_avx(auVar6,auVar35);
                auVar37 = vpaddd_avx(auVar37,auVar36._0_16_);
                auVar36 = ZEXT1664(auVar37);
                auVar35 = vpmaddwd_avx(auVar35,auVar5);
                auVar35 = vpaddd_avx(auVar35,auVar38._0_16_);
                auVar38 = ZEXT1664(auVar35);
                auVar4 = vpshufd_avx(auVar3,0xee);
                auVar3 = vpmaddwd_avx(auVar6,auVar4);
                auVar3 = vpaddd_avx(auVar3,auVar39._0_16_);
                auVar39 = ZEXT1664(auVar3);
                auVar4 = vpmaddwd_avx(auVar4,auVar5);
                auVar4 = vpaddd_avx(auVar4,auVar40._0_16_);
                auVar40 = ZEXT1664(auVar4);
                puVar23 = puVar23 + 1;
                pauVar26 = pauVar26 + 1;
                iVar27 = iVar27 + -1;
              } while (iVar27 != 0);
              auVar37 = vphaddd_avx(auVar37,auVar35);
              auVar38 = ZEXT1664(auVar37);
              auVar37 = vphaddd_avx(auVar3,auVar4);
              auVar36 = ZEXT1664(auVar37);
            }
            auVar35 = auVar36._0_16_;
            auVar37 = auVar38._0_16_;
            if (0 < iVar32) {
              lVar33 = 0;
              do {
                auVar37 = vpmovsxbw_avx(ZEXT216(*(ushort *)((long)puVar23 + lVar33 * 2)));
                auVar37 = vpshuflw_avx(auVar37,0x50);
                auVar4 = vpshufd_avx(auVar37,0x50);
                auVar35._8_8_ = 0;
                auVar35._0_8_ = *(ulong *)(*pauVar26 + lVar33 * 4);
                auVar37 = vpmovsxbw_avx(auVar35);
                auVar37 = vpshufd_avx(auVar37,0x44);
                auVar3 = vpmullw_avx(auVar4,auVar37);
                auVar35 = vpmulhw_avx(auVar4,auVar37);
                auVar37 = vpunpcklwd_avx(auVar3,auVar35);
                auVar37 = vpaddd_avx(auVar38._0_16_,auVar37);
                auVar38 = ZEXT1664(auVar37);
                auVar35 = vpunpckhwd_avx(auVar3,auVar35);
                auVar35 = vpaddd_avx(auVar36._0_16_,auVar35);
                auVar36 = ZEXT1664(auVar35);
                lVar33 = lVar33 + 1;
              } while (iVar32 != (int)lVar33);
            }
            *pauVar20 = auVar37;
            pauVar20[1] = auVar35;
            pauVar20 = pauVar20 + 2;
            uVar31 = uVar15 + 2;
            lVar33 = uVar15 + 3;
            uVar15 = uVar31;
          } while (lVar33 < (long)uVar10);
        }
        if ((int)uVar31 < (int)uVar1) {
          do {
            puVar23 = (ulong *)((((uint)uVar31 & 1) + ((uint)(uVar31 >> 1) & 0x7fffffff)) *
                                local_a8.cstep * local_a8.elemsize + (long)local_a8.data);
            pauVar26 = (undefined1 (*) [16])
                       (kernel->cstep * uVar16 * kernel->elemsize + (long)kernel->data);
            auVar36 = ZEXT1664((undefined1  [16])0x0);
            if (0 < iVar9) {
              auVar38 = ZEXT1664((undefined1  [16])0x0);
              auVar39 = ZEXT1664((undefined1  [16])0x0);
              auVar40 = ZEXT1664((undefined1  [16])0x0);
              iVar27 = iVar9;
              do {
                auVar3._8_8_ = 0;
                auVar3._0_8_ = *puVar23;
                auVar3 = vpmovsxbw_avx(auVar3);
                auVar37 = *pauVar26;
                auVar35 = vpcmpgtb_avx((undefined1  [16])0x0,auVar37);
                auVar5 = vpunpcklbw_avx(auVar37,auVar35);
                auVar4 = vpunpckhbw_avx(auVar37,auVar35);
                auVar37 = vpshufd_avx(auVar3,0x44);
                auVar3 = vpmullw_avx(auVar5,auVar37);
                auVar35 = vpmulhw_avx(auVar5,auVar37);
                auVar5 = vpmullw_avx(auVar37,auVar4);
                auVar4 = vpmulhw_avx(auVar37,auVar4);
                auVar37 = vpunpcklwd_avx(auVar3,auVar35);
                auVar37 = vpaddd_avx(auVar40._0_16_,auVar37);
                auVar40 = ZEXT1664(auVar37);
                auVar35 = vpunpckhwd_avx(auVar3,auVar35);
                auVar35 = vpaddd_avx(auVar39._0_16_,auVar35);
                auVar39 = ZEXT1664(auVar35);
                auVar3 = vpunpcklwd_avx(auVar5,auVar4);
                auVar3 = vpaddd_avx(auVar38._0_16_,auVar3);
                auVar38 = ZEXT1664(auVar3);
                auVar4 = vpunpckhwd_avx(auVar5,auVar4);
                auVar4 = vpaddd_avx(auVar36._0_16_,auVar4);
                auVar36 = ZEXT1664(auVar4);
                puVar23 = (ulong *)((long)puVar23 + 4);
                pauVar26 = pauVar26 + 1;
                iVar27 = iVar27 + -1;
              } while (iVar27 != 0);
              auVar5 = vpunpckldq_avx(auVar37,auVar35);
              auVar6 = vpunpckldq_avx(auVar3,auVar4);
              auVar35 = vpunpckhdq_avx(auVar37,auVar35);
              auVar3 = vpunpckhdq_avx(auVar3,auVar4);
              auVar4 = vpunpcklqdq_avx(auVar5,auVar6);
              auVar37 = vpunpckhqdq_avx(auVar5,auVar6);
              auVar37 = vpaddd_avx(auVar4,auVar37);
              auVar4 = vpunpcklqdq_avx(auVar35,auVar3);
              auVar35 = vpunpckhqdq_avx(auVar35,auVar3);
              auVar35 = vpaddd_avx(auVar35,auVar4);
              auVar37 = vpaddd_avx(auVar37,auVar35);
              auVar36 = ZEXT1664(auVar37);
            }
            auVar37 = auVar36._0_16_;
            if (0 < iVar32) {
              lVar33 = 0;
              do {
                auVar37 = vpshuflw_avx(ZEXT416((uint)(int)*(char *)((long)puVar23 + lVar33)),0);
                auVar3 = vpshufd_avx(auVar37,0);
                auVar4._8_8_ = 0;
                auVar4._0_8_ = *(ulong *)(*pauVar26 + lVar33 * 4);
                auVar37 = vpmovsxbw_avx(auVar4);
                auVar35 = vpmullw_avx(auVar3,auVar37);
                auVar37 = vpmulhw_avx(auVar3,auVar37);
                auVar37 = vpunpcklwd_avx(auVar35,auVar37);
                auVar37 = vpaddd_avx(auVar36._0_16_,auVar37);
                auVar36 = ZEXT1664(auVar37);
                lVar33 = lVar33 + 1;
              } while (iVar32 != (int)lVar33);
            }
            *pauVar20 = auVar37;
            pauVar20 = pauVar20 + 1;
            uVar21 = (uint)uVar31 + 1;
            uVar31 = (ulong)uVar21;
          } while (uVar21 != uVar1);
        }
        uVar16 = uVar16 + 1;
      } while (uVar16 != local_50);
    }
    piVar7 = (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + -1;
      UNLOCK();
      if (*piVar7 == 0) {
        if (local_a8.allocator == (Allocator *)0x0) {
          if (local_a8.data != (void *)0x0) {
            free(local_a8.data);
          }
        }
        else {
          (*(local_a8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    return;
  }
  im2col_sgemm_pack1to4_int8_sse_xop(bottom_im2col,top_blob,kernel,opt);
  return;
}

Assistant:

static void im2col_sgemm_pack1to4_int8_sse(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Option& opt)
{
#if !(__AVX512VNNI__ || __AVXVNNI__ || __AVX2__ || __XOP__)
#if NCNN_RUNTIME_CPU && NCNN_AVX512VNNI && __AVX512F__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx512_vnni())
    {
        im2col_sgemm_pack1to4_int8_sse_avx512vnni(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVXVNNI && __AVX2__ && !__AVXVNNI__
    if (ncnn::cpu_support_x86_avx_vnni())
    {
        im2col_sgemm_pack1to4_int8_sse_avxvnni(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVX2 && __AVX__ && !__AVX2__
    if (ncnn::cpu_support_x86_avx2())
    {
        im2col_sgemm_pack1to4_int8_sse_avx2(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_XOP && __SSE2__ && !__XOP__
    if (ncnn::cpu_support_x86_xop())
    {
        im2col_sgemm_pack1to4_int8_sse_xop(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif
#endif

    // Mat bottom_im2col(size, maxk, inch, 8u, 8, opt.workspace_allocator);

    const int size = bottom_im2col.w;
    const int maxk = bottom_im2col.h;
    const int inch = bottom_im2col.c;

    const int outch = top_blob.c;

    // permute
    Mat tmp;
    if (inch >= 4)
    {
#if __AVX2__
        if (size >= 4)
            tmp.create(4 * maxk, inch / 4 + inch % 4, size / 4 + (size % 4) / 2 + size % 2, 4u, 4, opt.workspace_allocator);
        else if (size >= 2)
            tmp.create(2 * maxk, inch / 4 + inch % 4, size / 2 + size % 2, 4u, 4, opt.workspace_allocator);
        else
            tmp.create(maxk, inch / 4 + inch % 4, size, 4u, 4, opt.workspace_allocator);
#else
        if (size >= 2)
            tmp.create(2 * maxk, inch / 4 + inch % 4, size / 2 + size % 2, 4u, 4, opt.workspace_allocator);
        else
            tmp.create(maxk, inch / 4 + inch % 4, size, 4u, 4, opt.workspace_allocator);
#endif
    }
    else
    {
#if __AVX2__
        if (size >= 4)
            tmp.create(4 * maxk, inch, size / 4 + (size % 4) / 2 + size % 2, 1u, 1, opt.workspace_allocator);
        else if (size >= 2)
            tmp.create(2 * maxk, inch, size / 2 + size % 2, 1u, 1, opt.workspace_allocator);
        else
            tmp.create(maxk, inch, size, 1u, 1, opt.workspace_allocator);
#else
        if (size >= 2)
            tmp.create(2 * maxk, inch, size / 2 + size % 2, 1u, 1, opt.workspace_allocator);
        else
            tmp.create(maxk, inch, size, 1u, 1, opt.workspace_allocator);
#endif
    }
    {
#if __AVX2__
        int remain_size_start = 0;
        int nn_size = size >> 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 4;

            signed char* tmpptr = tmp.channel(i / 4);

            int q = 0;
            for (; q + 3 < inch; q += 4)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;
                const signed char* img1 = (const signed char*)bottom_im2col.channel(q + 1) + i;
                const signed char* img2 = (const signed char*)bottom_im2col.channel(q + 2) + i;
                const signed char* img3 = (const signed char*)bottom_im2col.channel(q + 3) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr[1] = img1[0];
                    tmpptr[2] = img2[0];
                    tmpptr[3] = img3[0];
                    tmpptr[4] = img0[1];
                    tmpptr[5] = img1[1];
                    tmpptr[6] = img2[1];
                    tmpptr[7] = img3[1];
                    tmpptr[8] = img0[2];
                    tmpptr[9] = img1[2];
                    tmpptr[10] = img2[2];
                    tmpptr[11] = img3[2];
                    tmpptr[12] = img0[3];
                    tmpptr[13] = img1[3];
                    tmpptr[14] = img2[3];
                    tmpptr[15] = img3[3];
                    tmpptr += 16;

                    img0 += size;
                    img1 += size;
                    img2 += size;
                    img3 += size;
                }
            }
            for (; q < inch; q++)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr[1] = img0[1];
                    tmpptr[2] = img0[2];
                    tmpptr[3] = img0[3];

                    tmpptr += 4;

                    img0 += size;
                }
            }
        }

        remain_size_start += nn_size << 2;
        nn_size = (size - remain_size_start) >> 1;
#else
        int remain_size_start = 0;
        int nn_size = (size - remain_size_start) >> 1;
#endif

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 2;

#if __AVX2__
            signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);
#else
            signed char* tmpptr = tmp.channel(i / 2);
#endif

            int q = 0;
            for (; q + 3 < inch; q += 4)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;
                const signed char* img1 = (const signed char*)bottom_im2col.channel(q + 1) + i;
                const signed char* img2 = (const signed char*)bottom_im2col.channel(q + 2) + i;
                const signed char* img3 = (const signed char*)bottom_im2col.channel(q + 3) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr[1] = img1[0];
                    tmpptr[2] = img2[0];
                    tmpptr[3] = img3[0];
                    tmpptr[4] = img0[1];
                    tmpptr[5] = img1[1];
                    tmpptr[6] = img2[1];
                    tmpptr[7] = img3[1];
                    tmpptr += 8;

                    img0 += size;
                    img1 += size;
                    img2 += size;
                    img3 += size;
                }
            }
            for (; q < inch; q++)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr[1] = img0[1];

                    tmpptr += 2;

                    img0 += size;
                }
            }
        }

        remain_size_start += nn_size << 1;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < size; i++)
        {
#if __AVX2__
            signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);
#else
            signed char* tmpptr = tmp.channel(i / 2 + i % 2);
#endif

            int q = 0;
            for (; q + 3 < inch; q += 4)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;
                const signed char* img1 = (const signed char*)bottom_im2col.channel(q + 1) + i;
                const signed char* img2 = (const signed char*)bottom_im2col.channel(q + 2) + i;
                const signed char* img3 = (const signed char*)bottom_im2col.channel(q + 3) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr[1] = img1[0];
                    tmpptr[2] = img2[0];
                    tmpptr[3] = img3[0];
                    tmpptr += 4;

                    img0 += size;
                    img1 += size;
                    img2 += size;
                    img3 += size;
                }
            }
            for (; q < inch; q++)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];

                    tmpptr += 1;

                    img0 += size;
                }
            }
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        int* outptr0 = top_blob.channel(p);

        int i = 0;
#if __AVX2__
        for (; i + 3 < size; i += 4)
        {
            const signed char* tmpptr = tmp.channel(i / 4);
            const signed char* kptr0 = kernel.channel(p);

            int nn4 = (inch / 4) * maxk;
            int nn1 = (inch % 4) * maxk;

            __m256i _sum00_12 = _mm256_setzero_si256();
            __m256i _sum20_32 = _mm256_setzero_si256();

            if (nn4 > 0)
            {
                __m256i _sum10_02 = _mm256_setzero_si256();
                __m256i _sum30_22 = _mm256_setzero_si256();

                int j = 0;
                for (; j < nn4; j++)
                {
                    __m128i _val0123 = _mm_loadu_si128((const __m128i*)tmpptr);
                    __m256i _val0123_16 = _mm256_cvtepi8_epi16(_val0123);

                    __m256i _val01_16 = _mm256_permute4x64_epi64(_val0123_16, _MM_SHUFFLE(1, 1, 0, 0));
                    __m256i _val23_16 = _mm256_permute4x64_epi64(_val0123_16, _MM_SHUFFLE(3, 3, 2, 2));

                    __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                    __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);

                    __m256i _val10_16 = _mm256_permute4x64_epi64(_val01_16, 78);
                    __m256i _val32_16 = _mm256_permute4x64_epi64(_val23_16, 78);

#if __AVXVNNI__ || __AVX512VNNI__
                    _sum00_12 = _mm256_dpwssd_epi32(_sum00_12, _val01_16, _w01_16);
                    _sum10_02 = _mm256_dpwssd_epi32(_sum10_02, _val10_16, _w01_16);
                    _sum20_32 = _mm256_dpwssd_epi32(_sum20_32, _val23_16, _w01_16);
                    _sum30_22 = _mm256_dpwssd_epi32(_sum30_22, _val32_16, _w01_16);
#else
                    _sum00_12 = _mm256_add_epi32(_sum00_12, _mm256_madd_epi16(_val01_16, _w01_16));
                    _sum10_02 = _mm256_add_epi32(_sum10_02, _mm256_madd_epi16(_val10_16, _w01_16));
                    _sum20_32 = _mm256_add_epi32(_sum20_32, _mm256_madd_epi16(_val23_16, _w01_16));
                    _sum30_22 = _mm256_add_epi32(_sum30_22, _mm256_madd_epi16(_val32_16, _w01_16));
#endif

                    tmpptr += 16;
                    kptr0 += 16;
                }

                _sum00_12 = _mm256_hadd_epi32(_sum00_12, _sum10_02);
                _sum20_32 = _mm256_hadd_epi32(_sum20_32, _sum30_22);

                _sum00_12 = _mm256_permute4x64_epi64(_sum00_12, _MM_SHUFFLE(2, 1, 3, 0));
                _sum20_32 = _mm256_permute4x64_epi64(_sum20_32, _MM_SHUFFLE(2, 1, 3, 0));
            }

            __m128i _sum00 = _mm256_extracti128_si256(_sum00_12, 0);
            __m128i _sum10 = _mm256_extracti128_si256(_sum00_12, 1);
            __m128i _sum20 = _mm256_extracti128_si256(_sum20_32, 0);
            __m128i _sum30 = _mm256_extracti128_si256(_sum20_32, 1);

            int j = 0;
            for (; j < nn1; j++)
            {
                __m128i _val01 = _mm_set_epi16(tmpptr[1], tmpptr[1], tmpptr[1], tmpptr[1], tmpptr[0], tmpptr[0], tmpptr[0], tmpptr[0]);
                __m128i _val23 = _mm_set_epi16(tmpptr[3], tmpptr[3], tmpptr[3], tmpptr[3], tmpptr[2], tmpptr[2], tmpptr[2], tmpptr[2]);

                __m128i _w0123 = _mm_set_epi16(kptr0[3], kptr0[2], kptr0[1], kptr0[0], kptr0[3], kptr0[2], kptr0[1], kptr0[0]);

                __m128i _sl00 = _mm_mullo_epi16(_val01, _w0123);
                __m128i _sh00 = _mm_mulhi_epi16(_val01, _w0123);
                __m128i _sl10 = _mm_mullo_epi16(_val23, _w0123);
                __m128i _sh10 = _mm_mulhi_epi16(_val23, _w0123);

                _sum00 = _mm_add_epi32(_sum00, _mm_unpacklo_epi16(_sl00, _sh00));
                _sum10 = _mm_add_epi32(_sum10, _mm_unpackhi_epi16(_sl00, _sh00));
                _sum20 = _mm_add_epi32(_sum20, _mm_unpacklo_epi16(_sl10, _sh10));
                _sum30 = _mm_add_epi32(_sum30, _mm_unpackhi_epi16(_sl10, _sh10));

                tmpptr += 4;
                kptr0 += 4;
            }

            _mm_storeu_si128((__m128i*)outptr0, _sum00);
            _mm_storeu_si128((__m128i*)(outptr0 + 4), _sum10);
            _mm_storeu_si128((__m128i*)(outptr0 + 8), _sum20);
            _mm_storeu_si128((__m128i*)(outptr0 + 12), _sum30);
            outptr0 += 16;
        }
#endif
        for (; i + 1 < size; i += 2)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2);
#endif
            const signed char* kptr0 = kernel.channel(p);

            int nn4 = (inch / 4) * maxk;
            int nn1 = (inch % 4) * maxk;

#if __AVX2__
            __m256i _sum00_12 = _mm256_setzero_si256();
#else
            __m128i _sum00 = _mm_setzero_si128();
            __m128i _sum10 = _mm_setzero_si128();
#endif

            if (nn4 > 0)
            {
#if __AVX2__
                __m256i _sum10_02 = _mm256_setzero_si256();
#else
                __m128i _sum01 = _mm_setzero_si128();
                __m128i _sum11 = _mm_setzero_si128();
#endif

                int j = 0;
                for (; j < nn4; j++)
                {
#if __AVX2__
                    __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                    __m256i _val01_16 = _mm256_cvtepi8_epi16(_val01);

                    _val01_16 = _mm256_permute4x64_epi64(_val01_16, _MM_SHUFFLE(1, 1, 0, 0));

                    __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                    __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);

                    __m256i _val10_16 = _mm256_permute4x64_epi64(_val01_16, 78);

#if __AVXVNNI__ || __AVX512VNNI__
                    _sum00_12 = _mm256_dpwssd_epi32(_sum00_12, _val01_16, _w01_16);
                    _sum10_02 = _mm256_dpwssd_epi32(_sum10_02, _val10_16, _w01_16);
#else
                    _sum00_12 = _mm256_add_epi32(_sum00_12, _mm256_madd_epi16(_val01_16, _w01_16));
                    _sum10_02 = _mm256_add_epi32(_sum10_02, _mm256_madd_epi16(_val10_16, _w01_16));
#endif
#else
                    __m128i _val01 = _mm_loadl_epi64((const __m128i*)tmpptr);
#if __SSE4_1__
                    _val01 = _mm_cvtepi8_epi16(_val01);
#else
                    __m128i _extval01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _val01);
                    _val01 = _mm_unpacklo_epi8(_val01, _extval01);
#endif

                    __m128i _val0 = _mm_shuffle_epi32(_val01, _MM_SHUFFLE(1, 0, 1, 0));
                    __m128i _val1 = _mm_shuffle_epi32(_val01, _MM_SHUFFLE(3, 2, 3, 2));

                    __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                    __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                    __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
                    __m128i _w1 = _mm_unpackhi_epi8(_w01, _extw01);

#if __XOP__
                    _sum00 = _mm_maddd_epi16(_val0, _w0, _sum00);
                    _sum01 = _mm_maddd_epi16(_val0, _w1, _sum01);
                    _sum10 = _mm_maddd_epi16(_val1, _w0, _sum10);
                    _sum11 = _mm_maddd_epi16(_val1, _w1, _sum11);
#else
                    _sum00 = _mm_add_epi32(_mm_madd_epi16(_val0, _w0), _sum00);
                    _sum01 = _mm_add_epi32(_mm_madd_epi16(_val0, _w1), _sum01);
                    _sum10 = _mm_add_epi32(_mm_madd_epi16(_val1, _w0), _sum10);
                    _sum11 = _mm_add_epi32(_mm_madd_epi16(_val1, _w1), _sum11);
#endif
#endif

                    tmpptr += 8;
                    kptr0 += 16;
                }

#if __AVX2__
                _sum00_12 = _mm256_hadd_epi32(_sum00_12, _sum10_02);

                _sum00_12 = _mm256_permute4x64_epi64(_sum00_12, _MM_SHUFFLE(2, 1, 3, 0));
#else
#if __SSSE3__
                _sum00 = _mm_hadd_epi32(_sum00, _sum01);
                _sum10 = _mm_hadd_epi32(_sum10, _sum11);
#else
                __m128i _sum00_sh = _mm_shuffle_epi32(_sum00, 216);
                __m128i _sum01_sh = _mm_shuffle_epi32(_sum01, 216);
                __m128i _sum10_sh = _mm_shuffle_epi32(_sum10, 216);
                __m128i _sum11_sh = _mm_shuffle_epi32(_sum11, 216);

                _sum00 = _mm_unpacklo_epi64(_sum00_sh, _sum01_sh);
                _sum01 = _mm_unpackhi_epi64(_sum00_sh, _sum01_sh);
                _sum10 = _mm_unpacklo_epi64(_sum10_sh, _sum11_sh);
                _sum11 = _mm_unpackhi_epi64(_sum10_sh, _sum11_sh);

                _sum00 = _mm_add_epi32(_sum00, _sum01);
                _sum10 = _mm_add_epi32(_sum10, _sum11);
#endif
#endif
            }

#if __AVX2__
            __m128i _sum00 = _mm256_extracti128_si256(_sum00_12, 0);
            __m128i _sum10 = _mm256_extracti128_si256(_sum00_12, 1);
#endif

            int j = 0;
            for (; j < nn1; j++)
            {
                __m128i _val = _mm_set_epi16(tmpptr[1], tmpptr[1], tmpptr[1], tmpptr[1], tmpptr[0], tmpptr[0], tmpptr[0], tmpptr[0]);

                __m128i _w0123 = _mm_loadl_epi64((const __m128i*)kptr0);
#if __SSE4_1__
                _w0123 = _mm_cvtepi8_epi16(_w0123);
#else
                __m128i _extw0123 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w0123);
                _w0123 = _mm_unpacklo_epi8(_w0123, _extw0123);
#endif

                _w0123 = _mm_shuffle_epi32(_w0123, _MM_SHUFFLE(1, 0, 1, 0));

                __m128i _sl00 = _mm_mullo_epi16(_val, _w0123);
                __m128i _sh00 = _mm_mulhi_epi16(_val, _w0123);

                _sum00 = _mm_add_epi32(_sum00, _mm_unpacklo_epi16(_sl00, _sh00));
                _sum10 = _mm_add_epi32(_sum10, _mm_unpackhi_epi16(_sl00, _sh00));

                tmpptr += 2;
                kptr0 += 4;
            }

            _mm_storeu_si128((__m128i*)outptr0, _sum00);
            _mm_storeu_si128((__m128i*)(outptr0 + 4), _sum10);
            outptr0 += 8;
        }
        for (; i < size; i++)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2 + i % 2);
#endif
            const signed char* kptr0 = kernel.channel(p);

            int nn4 = (inch / 4) * maxk;
            int nn1 = (inch % 4) * maxk;

            __m128i _sum0 = _mm_setzero_si128();

            if (nn4 > 0)
            {
                __m128i _sum1 = _mm_setzero_si128();
                __m128i _sum2 = _mm_setzero_si128();
                __m128i _sum3 = _mm_setzero_si128();

                int j = 0;
                for (; j < nn4; j++)
                {
                    __m128i _val01 = _mm_loadl_epi64((const __m128i*)tmpptr);
#if __SSE4_1__
                    __m128i _val0 = _mm_cvtepi8_epi16(_val01);
#else
                    __m128i _extval01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _val01);
                    __m128i _val0 = _mm_unpacklo_epi8(_val01, _extval01);
#endif

                    _val0 = _mm_shuffle_epi32(_val0, _MM_SHUFFLE(1, 0, 1, 0));

                    __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                    __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                    __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
                    __m128i _w1 = _mm_unpackhi_epi8(_w01, _extw01);

                    __m128i _sl00 = _mm_mullo_epi16(_val0, _w0);
                    __m128i _sh00 = _mm_mulhi_epi16(_val0, _w0);
                    __m128i _sl01 = _mm_mullo_epi16(_val0, _w1);
                    __m128i _sh01 = _mm_mulhi_epi16(_val0, _w1);

                    _sum0 = _mm_add_epi32(_sum0, _mm_unpacklo_epi16(_sl00, _sh00));
                    _sum1 = _mm_add_epi32(_sum1, _mm_unpackhi_epi16(_sl00, _sh00));
                    _sum2 = _mm_add_epi32(_sum2, _mm_unpacklo_epi16(_sl01, _sh01));
                    _sum3 = _mm_add_epi32(_sum3, _mm_unpackhi_epi16(_sl01, _sh01));

                    tmpptr += 4;
                    kptr0 += 16;
                }

                // transpose 4x4
                {
                    __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                    _tmp0 = _mm_unpacklo_epi32(_sum0, _sum1);
                    _tmp1 = _mm_unpacklo_epi32(_sum2, _sum3);
                    _tmp2 = _mm_unpackhi_epi32(_sum0, _sum1);
                    _tmp3 = _mm_unpackhi_epi32(_sum2, _sum3);
                    _sum0 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                    _sum1 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                    _sum2 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                    _sum3 = _mm_unpackhi_epi64(_tmp2, _tmp3);
                }

                _sum0 = _mm_add_epi32(_sum0, _sum1);
                _sum2 = _mm_add_epi32(_sum2, _sum3);
                _sum0 = _mm_add_epi32(_sum0, _sum2);
            }

            int j = 0;
            for (; j < nn1; j++)
            {
                __m128i _val = _mm_set1_epi16(tmpptr[0]);

                __m128i _w0123 = _mm_loadl_epi64((const __m128i*)kptr0);
#if __SSE4_1__
                _w0123 = _mm_cvtepi8_epi16(_w0123);
#else
                __m128i _extw0123 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w0123);
                _w0123 = _mm_unpacklo_epi8(_w0123, _extw0123);
#endif

                __m128i _sl00 = _mm_mullo_epi16(_val, _w0123);
                __m128i _sh00 = _mm_mulhi_epi16(_val, _w0123);

                _sum0 = _mm_add_epi32(_sum0, _mm_unpacklo_epi16(_sl00, _sh00));

                tmpptr += 1;
                kptr0 += 4;
            }

            _mm_storeu_si128((__m128i*)outptr0, _sum0);
            outptr0 += 4;
        }
    }
}